

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.hpp
# Opt level: O0

void __thiscall Character::~Character(Character *this)

{
  Animation *local_18;
  Character *this_local;
  
  Portal::~Portal(&this->orangePortal);
  Portal::~Portal(&this->bluePortal);
  local_18 = (Animation *)&this->state;
  do {
    local_18 = local_18 + -1;
    piksel::Animation::~Animation(local_18);
  } while (local_18 != this->animations);
  return;
}

Assistant:

Character(glm::vec2 center, glm::vec2 halfDimension)
        : AABB(center, halfDimension)
        , state(IDLE)
        , towardsLeft(false)
        , grounded(false)
        , velocity(0.0f, 0.0f)
        , runAcceleration(0.0f, 0.0f)
        , jumpAcceleration(0.0f, 0.0f)
        , invincible(false)
        , timeOfDeathInMillis(-1)
        , lives(3)
        , bluePortal(true)
        , orangePortal(false)
    {}